

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnData::InitializeScanWithOffset
          (ListColumnData *this,ColumnScanState *state,idx_t row_idx)

{
  int iVar1;
  reference pvVar2;
  uint64_t uVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  
  if (row_idx != 0) {
    ColumnData::InitializeScanWithOffset(&this->super_ColumnData,state,row_idx);
    uVar3 = 0;
    pvVar2 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,0);
    ColumnData::InitializeScanWithOffset(&(this->validity).super_ColumnData,pvVar2,row_idx);
    if ((this->super_ColumnData).start != row_idx) {
      uVar3 = FetchListOffset(this,row_idx - 1);
    }
    pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    iVar1 = (*pCVar4->_vptr_ColumnData[3])(pCVar4);
    if (uVar3 < CONCAT44(extraout_var,iVar1)) {
      pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(&this->child_column);
      pvVar2 = vector<duckdb::ColumnScanState,_true>::operator[](&state->child_states,1);
      (*pCVar4->_vptr_ColumnData[8])(pCVar4,pvVar2,(this->super_ColumnData).start + uVar3);
    }
    state->last_offset = uVar3;
    return;
  }
  (*(this->super_ColumnData)._vptr_ColumnData[7])(this,state);
  return;
}

Assistant:

void ListColumnData::InitializeScanWithOffset(ColumnScanState &state, idx_t row_idx) {
	if (row_idx == 0) {
		InitializeScan(state);
		return;
	}
	ColumnData::InitializeScanWithOffset(state, row_idx);

	// initialize the validity segment
	D_ASSERT(state.child_states.size() == 2);
	validity.InitializeScanWithOffset(state.child_states[0], row_idx);

	// we need to read the list at position row_idx to get the correct row offset of the child
	auto child_offset = row_idx == start ? 0 : FetchListOffset(row_idx - 1);
	D_ASSERT(child_offset <= child_column->GetMaxEntry());
	if (child_offset < child_column->GetMaxEntry()) {
		child_column->InitializeScanWithOffset(state.child_states[1], start + child_offset);
	}
	state.last_offset = child_offset;
}